

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

void checkformat(lua_State *L,char *form,char *flags,int precision)

{
  size_t sVar1;
  ushort **ppuVar2;
  byte *local_30;
  char *spec;
  int precision_local;
  char *flags_local;
  char *form_local;
  lua_State *L_local;
  
  sVar1 = strspn(form + 1,flags);
  local_30 = (byte *)(form + 1 + sVar1);
  if (((*local_30 != 0x30) && (local_30 = (byte *)get2digits((char *)local_30), *local_30 == 0x2e))
     && (precision != 0)) {
    local_30 = (byte *)get2digits((char *)(local_30 + 1));
  }
  ppuVar2 = __ctype_b_loc();
  if (((*ppuVar2)[(int)(uint)*local_30] & 0x400) == 0) {
    luaL_error(L,"invalid conversion specification: \'%s\'",form);
  }
  return;
}

Assistant:

static void checkformat (lua_State *L, const char *form, const char *flags,
                                       int precision) {
  const char *spec = form + 1;  /* skip '%' */
  spec += strspn(spec, flags);  /* skip flags */
  if (*spec != '0') {  /* a width cannot start with '0' */
    spec = get2digits(spec);  /* skip width */
    if (*spec == '.' && precision) {
      spec++;
      spec = get2digits(spec);  /* skip precision */
    }
  }
  if (!isalpha(uchar(*spec)))  /* did not go to the end? */
    luaL_error(L, "invalid conversion specification: '%s'", form);
}